

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

uint16_t mipsdsp_sat16_lshift(uint16_t a,uint8_t s,CPUMIPSState_conflict5 *env)

{
  char cVar1;
  undefined2 local_1c;
  uint16_t discard;
  uint8_t sign;
  CPUMIPSState_conflict5 *env_local;
  uint8_t s_local;
  uint16_t a_local;
  
  env_local._6_2_ = a;
  if (s != '\0') {
    cVar1 = (char)((int)(uint)a >> 0xf);
    if (cVar1 == '\0') {
      local_1c = (ushort)((int)(uint)a >> (0xe - (s + 0xff) & 0x1f));
    }
    else {
      local_1c = (ushort)((1 << (0x10 - s & 0x1f)) + -1 << (s & 0x1f)) |
                 (ushort)((int)(uint)a >> (0xe - (s + 0xff) & 0x1f)) & (short)(1 << (s & 0x1f)) - 1U
      ;
    }
    if ((local_1c == 0) || (local_1c == 0xffff)) {
      env_local._6_2_ = a << (s & 0x1f);
    }
    else {
      set_DSPControl_overflow_flag(1,0x16,env);
      env_local._6_2_ = 0x8000;
      if (cVar1 == '\0') {
        env_local._6_2_ = 0x7fff;
      }
    }
  }
  return env_local._6_2_;
}

Assistant:

static inline uint16_t mipsdsp_sat16_lshift(uint16_t a, uint8_t s,
                                            CPUMIPSState *env)
{
    uint8_t  sign;
    uint16_t discard;

    if (s == 0) {
        return a;
    } else {
        sign = (a >> 15) & 0x01;
        if (sign != 0) {
            discard = (((0x01 << (16 - s)) - 1) << s) |
                      ((a >> (14 - (s - 1))) & ((0x01 << s) - 1));
        } else {
            discard = a >> (14 - (s - 1));
        }

        if ((discard != 0x0000) && (discard != 0xFFFF)) {
            set_DSPControl_overflow_flag(1, 22, env);
            return (sign == 0) ? 0x7FFF : 0x8000;
        } else {
            return a << s;
        }
    }
}